

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O3

void __thiscall Mat::Mat(Mat *this,Mat *rhs)

{
  int iVar1;
  int iVar2;
  double *pdVar3;
  double *pdVar4;
  uint uVar5;
  ulong uVar6;
  
  iVar1 = rhs->n_rows_;
  this->n_rows_ = iVar1;
  iVar2 = rhs->n_cols_;
  this->n_cols_ = iVar2;
  uVar5 = iVar2 * iVar1;
  if (iVar1 < 1) {
    pdVar4 = (double *)0x0;
  }
  else {
    uVar6 = 0xffffffffffffffff;
    if (-1 < (int)uVar5) {
      uVar6 = (long)(int)uVar5 * 8;
    }
    pdVar4 = (double *)operator_new__(uVar6);
  }
  this->v_ = pdVar4;
  if (0 < (int)uVar5) {
    pdVar3 = rhs->v_;
    uVar6 = 0;
    do {
      pdVar4[uVar6] = pdVar3[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
  }
  return;
}

Assistant:

Mat::Mat(const Mat &rhs) : n_rows_(rhs.n_rows_),n_cols_(rhs.n_cols_), v_(n_rows_>0 ? new double[n_rows_*n_cols_] : NULL)
{
	for (int i=0; i<n_rows_*n_cols_; i++)
		v_[i] = rhs.v_[i];
}